

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O2

int KINSetJacFn(void *kinmem,KINLsJacFn jac)

{
  int iVar1;
  KINMem kin_mem;
  KINLsMem kinls_mem;
  
  iVar1 = kinLs_AccessLMem(kinmem,"KINSetJacFn",&kin_mem,&kinls_mem);
  if (iVar1 == 0) {
    if (jac == (KINLsJacFn)0x0) {
      kinls_mem->jacDQ = 1;
      kinls_mem->jac = kinLsDQJac;
    }
    else {
      if (kinls_mem->J == (SUNMatrix)0x0) {
        KINProcessError(kin_mem,-3,0xf6,"KINSetJacFn",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                        ,"Jacobian routine cannot be supplied for NULL SUNMatrix");
        return -3;
      }
      kinls_mem->jacDQ = 0;
      kinls_mem->jac = jac;
      kin_mem = (KINMem)kin_mem->kin_user_data;
    }
    kinls_mem->J_data = kin_mem;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int KINSetJacFn(void* kinmem, KINLsJacFn jac)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;
  int retval;

  /* access KINLsMem structure */
  retval = kinLs_AccessLMem(kinmem, __func__, &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS) { return (retval); }

  /* return with failure if jac cannot be used */
  if ((jac != NULL) && (kinls_mem->J == NULL))
  {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Jacobian routine cannot be supplied for NULL SUNMatrix");
    return (KINLS_ILL_INPUT);
  }

  if (jac != NULL)
  {
    kinls_mem->jacDQ  = SUNFALSE;
    kinls_mem->jac    = jac;
    kinls_mem->J_data = kin_mem->kin_user_data;
  }
  else
  {
    kinls_mem->jacDQ  = SUNTRUE;
    kinls_mem->jac    = kinLsDQJac;
    kinls_mem->J_data = kin_mem;
  }

  return (KINLS_SUCCESS);
}